

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatString.hpp
# Opt level: O0

void Diligent::
     FormatStrSS<std::__cxx11::stringstream,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
               (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss,
               char (*FirstArg) [54],
               IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *RestArgs,
               char (*RestArgs_1) [54],
               IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *RestArgs_2,
               char (*RestArgs_3) [117])

{
  char (*RestArgs_local_3) [117];
  IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *RestArgs_local_2;
  char (*RestArgs_local_1) [54];
  IndexWrapper<unsigned_char,_Diligent::_SoftwareQueueIndexTag> *RestArgs_local;
  char (*FirstArg_local) [54];
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *ss_local;
  
  FormatStrSS<std::__cxx11::stringstream,char[54]>(ss,FirstArg);
  FormatStrSS<std::__cxx11::stringstream,Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[54],Diligent::IndexWrapper<unsigned_char,Diligent::_SoftwareQueueIndexTag>,char[117]>
            (ss,RestArgs,RestArgs_1,RestArgs_2,RestArgs_3);
  return;
}

Assistant:

void FormatStrSS(SSType& ss, const FirstArgType& FirstArg, const RestArgsType&... RestArgs)
{
    FormatStrSS(ss, FirstArg);
    FormatStrSS(ss, RestArgs...); // recursive call using pack expansion syntax
}